

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_format_pre.c
# Opt level: O3

int mpt_parse_format_pre(mpt_parser_format *fmt,mpt_parser_context *parse,mpt_path *path)

{
  uint8_t *com;
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  
  com = fmt->com;
  uVar1 = mpt_parse_nextvis(&parse->src,com,4);
  if ((int)uVar1 < 0) {
    return (uint)(path->len == 0) * 0x10 + -0x10;
  }
  if (uVar1 == fmt->sstart) {
    parse->curr = '\x01';
  }
  else {
    parse->curr = '\b';
    iVar2 = mpt_path_addchar(path,uVar1);
    if (iVar2 < 0) {
      return -0x11;
    }
    do {
      if (uVar1 == fmt->send) {
        parse->curr = '\x02';
        return 2;
      }
      if (uVar1 == fmt->sstart) break;
      if (uVar1 == fmt->ostart) {
        iVar2 = mpt_parse_option(fmt,parse,path);
        return iVar2;
      }
      if (uVar1 == fmt->assign) {
        parse->curr = '\v';
        iVar2 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                 (uint)(parse->name).opt);
        if (-1 < iVar2) {
          iVar2 = mpt_path_add(path,(uint)parse->valid);
          if (iVar2 < 0) {
            return -4;
          }
          mpt_path_invalidate(path);
          parse->valid = 0;
          iVar2 = mpt_parse_data(fmt,parse,path);
          if (iVar2 < 0) {
            return iVar2;
          }
          return (uint)(iVar2 != 0) * 4 + 3;
        }
        goto LAB_0011a088;
      }
      if (uVar1 == fmt->oend) break;
      if ((uVar1 != 0) &&
         ((((uVar1 == *com || (uVar1 == fmt->com[1])) || (uVar1 == fmt->com[2])) ||
          (uVar1 == fmt->com[3])))) {
        mpt_parse_endline(&parse->src);
        break;
      }
      parse->curr = '\b';
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)uVar1 * 2 + 1) & 0x20) == 0) {
        iVar2 = mpt_path_valid(path);
        parse->valid = (uint16_t)iVar2;
      }
      else if (uVar1 == 10) {
        uVar1 = mpt_parse_nextvis(&parse->src,com,4);
        iVar2 = mpt_path_addchar(path,uVar1);
        if (iVar2 < 0) {
          return -0x11;
        }
        break;
      }
      uVar1 = mpt_parse_getchar(&parse->src,path);
    } while (-1 < (int)uVar1);
    if (uVar1 != fmt->sstart || fmt->sstart == 0) {
      if (uVar1 != fmt->oend || fmt->oend == 0) {
        parse->curr = '\b';
        return -2;
      }
      parse->curr = '\x04';
      iVar2 = mpt_parse_ncheck(path->base + path->len + path->off,0,(uint)(parse->name).opt);
      if (-1 < iVar2) {
        return 4;
      }
      return -3;
    }
    parse->curr = '\t';
  }
  iVar2 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                           (uint)(parse->name).sect);
  if (iVar2 < 0) {
LAB_0011a088:
    iVar2 = -3;
  }
  else {
    uVar1 = mpt_path_add(path,(uint)parse->valid);
    iVar2 = ((int)~uVar1 >> 0x1f) * -5 + -4;
  }
  return iVar2;
}

Assistant:

extern int mpt_parse_format_pre(const MPT_STRUCT(parser_format) *fmt, MPT_STRUCT(parser_context) *parse, MPT_STRUCT(path) *path)
{
	int curr;
	
	/* get next visible character, no save */
	if ((curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com))) < 0) {
		if (!path->len) {
			return 0;
		}
		return MPT_ERROR(MissingData);
	}
	if (curr == fmt->sstart) {
		parse->curr = MPT_PARSEFLAG(Section);
		if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.sect) < 0) {
			return MPT_ERROR(BadType);
		}
		if (mpt_path_add(path, parse->valid) < 0) {
			return MPT_ERROR(BadOperation);
		}
		return MPT_PARSEFLAG(Section);
	}
	parse->curr = MPT_PARSEFLAG(Name);
	if (mpt_path_addchar(path, curr) < 0) {
		return MPT_ERROR(MissingBuffer);
	}
	do {
		if (curr < 0) {
			return MPT_ERROR(MissingData);
		}
		/* found section end */
		if (curr == fmt->send) {
			return parse->curr = MPT_PARSEFLAG(SectEnd);
		}
		/* found section start */
		if (curr == fmt->sstart) {
			break;
		}
		/* parse option name */
		if (curr == fmt->ostart) {
			return mpt_parse_option(fmt, parse, path);
		}
		/* parse option data */
		if (curr == fmt->assign) {
			parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
			if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
				return MPT_ERROR(BadType);
			}
			if (mpt_path_add(path, parse->valid) < 0) {
				return MPT_ERROR(BadOperation);
			}
			/* clear trailing path data */
			mpt_path_invalidate(path);
			parse->valid = 0;
			
			if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
				return curr;
			}
			if (!curr) {
				return MPT_PARSEFLAG(Option);
			}
			return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
		}
		/* data end found */
		if (curr == fmt->oend) {
			break;
		}
		/* comments: continue to line end without save */
		if (MPT_iscomment(fmt, curr)) {
			(void) mpt_parse_endline(&parse->src);
			break;
		}
		parse->curr = MPT_PARSEFLAG(Name);
		
		/* validate current length character */
		if (!isspace(curr)) {
			parse->valid = mpt_path_valid(path);
		}
		/* get next visible character, no save */
		else if (curr == '\n') {
			curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com));
			if (mpt_path_addchar(path, curr) < 0) {
				return MPT_ERROR(MissingBuffer);
			}
			break;
		}
	} while ((curr = mpt_parse_getchar(&parse->src, path)) >= 0);
	
	/* last chance to get section start */
	if (fmt->sstart && curr == fmt->sstart) {
		parse->curr = MPT_PARSEFLAG(Section) | MPT_PARSEFLAG(Name);
		if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.sect) < 0) {
			return MPT_ERROR(BadType);
		}
		if (mpt_path_add(path, parse->valid) < 0) {
			return MPT_ERROR(BadOperation);
		}
		return MPT_PARSEFLAG(Section);
	}
	/* try to pass as data */
	if (fmt->oend && curr == fmt->oend) {
		parse->curr = MPT_PARSEFLAG(Data);
		/* set zero length option name */
		if (mpt_parse_ncheck(path->base + path->off + path->len, 0, parse->name.opt) < 0) {
			return MPT_ERROR(BadType);
		}
		return MPT_PARSEFLAG(Data);
	}
	parse->curr = MPT_PARSEFLAG(Name);
	return MPT_ERROR(BadValue);
}